

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O3

void Curl_mime_cleanpart(curl_mimepart *part)

{
  cleanup_part_content(part);
  curl_slist_free_all(part->curlheaders);
  if ((part->flags & 1) != 0) {
    curl_slist_free_all(part->userheaders);
  }
  (*Curl_cfree)(part->mimetype);
  part->mimetype = (char *)0x0;
  (*Curl_cfree)(part->name);
  part->name = (char *)0x0;
  (*Curl_cfree)(part->filename);
  memset(&part->parent,0,0x1b8);
  part->lastreadstatus = 1;
  (part->state).ptr = (void *)0x0;
  (part->state).offset = 0;
  return;
}

Assistant:

void Curl_mime_cleanpart(curl_mimepart *part)
{
  cleanup_part_content(part);
  curl_slist_free_all(part->curlheaders);
  if(part->flags & MIME_USERHEADERS_OWNER)
    curl_slist_free_all(part->userheaders);
  Curl_safefree(part->mimetype);
  Curl_safefree(part->name);
  Curl_safefree(part->filename);
  Curl_mime_initpart(part, part->easy);
}